

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

level_info_t * __thiscall level_info_t::CheckLevelRedirect(level_info_t *this)

{
  bool bVar1;
  PClass *p;
  PClassActor *type;
  AInventory *pAVar2;
  level_info_t *plVar3;
  int i;
  long lVar4;
  undefined8 *puVar5;
  FName local_34;
  
  if ((this->RedirectType).Index != 0) {
    p = PClass::FindClass(&local_34);
    type = dyn_cast<PClassActor>((DObject *)p);
    if (type != (PClassActor *)0x0) {
      puVar5 = &players;
      lVar4 = 0;
      while ((playeringame[lVar4] != true ||
             (pAVar2 = AActor::FindInventory((AActor *)*puVar5,type,false),
             pAVar2 == (AInventory *)0x0))) {
        lVar4 = lVar4 + 1;
        puVar5 = puVar5 + 0x54;
        if (lVar4 == 8) {
          return (level_info_t *)0x0;
        }
      }
      bVar1 = P_CheckMapData((this->RedirectMapName).Chars);
      if (bVar1) {
        plVar3 = FindLevelInfo((this->RedirectMapName).Chars,true);
        return plVar3;
      }
    }
  }
  return (level_info_t *)0x0;
}

Assistant:

level_info_t *FindLevelInfo (const char *mapname, bool allowdefault)
{
	int i;

	if ((i = FindWadLevelInfo (mapname)) > -1)
	{
		return &wadlevelinfos[i];
	}
	else if (allowdefault)
	{
		if (TheDefaultLevelInfo.LevelName.IsEmpty())
		{
			TheDefaultLevelInfo.SkyPic2 = TheDefaultLevelInfo.SkyPic1 = "SKY1";
			TheDefaultLevelInfo.LevelName = "Unnamed";
		}
		return &TheDefaultLevelInfo;
	}
	return NULL;
}